

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduce.c
# Opt level: O1

IceTImage icetReduceCompose(void)

{
  ulong uVar1;
  int *piVar2;
  uint uVar3;
  IceTSizeType height;
  bool bVar4;
  IceTBoolean IVar5;
  int iVar6;
  uint uVar7;
  IceTSizeType IVar8;
  IceTInt *pIVar9;
  IceTVoid *pIVar10;
  IceTVoid *pIVar11;
  IceTVoid *__s;
  IceTVoid *pIVar12;
  IceTSparseImage IVar13;
  IceTSparseImage IVar14;
  IceTSparseImage IVar15;
  IceTImage IVar16;
  int iVar17;
  long lVar18;
  int iVar19;
  long lVar20;
  IceTSizeType piece_offset_00;
  bool bVar21;
  int iVar22;
  long lVar23;
  int *piVar24;
  long lVar25;
  ulong uVar26;
  ulong uVar27;
  IceTBoolean *pIVar28;
  IceTInt *pIVar29;
  ulong uVar30;
  IceTSizeType *pIVar31;
  IceTInt num_processes;
  IceTSparseImage composited_image;
  IceTInt rank;
  IceTSizeType piece_offset;
  IceTSparseImage rendered_image;
  uint local_94;
  IceTSparseImage local_90;
  int local_88;
  IceTInt local_84;
  IceTInt *local_80;
  IceTBoolean *local_78;
  IceTSizeType local_6c;
  IceTInt *local_68;
  IceTInt *local_60;
  IceTImage local_58;
  IceTBoolean *local_50;
  ulong local_48;
  IceTInt *local_40;
  IceTSparseImage local_38;
  
  local_78 = icetUnsafeStateGetBoolean(0x89);
  pIVar9 = icetUnsafeStateGetInteger(0x8a);
  icetGetIntegerv(0x8b,(IceTInt *)&local_38);
  local_58.opaque_internals = icetUnsafeStateGetInteger(0x1a);
  local_40 = icetUnsafeStateGetInteger(0x29);
  icetGetIntegerv(0x10,(IceTInt *)&local_90);
  icetGetIntegerv(3,(IceTInt *)&local_94);
  icetGetIntegerv(2,&local_88);
  if ((int)local_38.opaque_internals < 1) {
    uVar26 = 0xffffffff;
    local_68 = (IceTInt *)0x0;
    local_48 = 0;
  }
  else {
    pIVar10 = icetGetStateBuffer(0x1a5,(uint)local_90.opaque_internals << 2);
    pIVar11 = icetGetStateBuffer(0x1a6,local_94 << 2);
    local_60 = (IceTInt *)icetGetStateBuffer(0x1a7,(uint)local_90.opaque_internals * local_94 * 4);
    __s = icetGetStateBuffer(0x1a8,(uint)local_90.opaque_internals << 2);
    local_68 = (IceTInt *)icetGetStateBuffer(0x1a9,(uint)local_90.opaque_internals << 2);
    pIVar12 = icetGetStateBuffer(0x1aa,local_94 << 2);
    if ((int)(uint)local_90.opaque_internals < 1) {
      iVar17 = 0;
    }
    else {
      lVar23 = 0;
      iVar17 = 0;
      do {
        iVar22 = pIVar9[lVar23];
        iVar6 = (int)(local_94 * iVar22) / (int)local_38.opaque_internals;
        iVar19 = iVar6;
        if (iVar6 < 2) {
          iVar19 = 1;
        }
        if (0 < iVar22) {
          iVar6 = iVar19;
        }
        if (iVar22 <= iVar6) {
          iVar6 = iVar22;
        }
        *(int *)((long)pIVar10 + lVar23 * 4) = iVar6;
        iVar17 = iVar17 + iVar6;
        lVar23 = lVar23 + 1;
      } while (lVar23 < (int)(uint)local_90.opaque_internals);
    }
    for (; iVar17 < (int)local_94; iVar17 = iVar17 + 1) {
      if ((long)(int)(uint)local_90.opaque_internals < 2) {
        lVar23 = 0;
      }
      else {
        iVar22 = 0;
        lVar23 = 1;
        do {
          iVar6 = *(int *)((long)pIVar10 + lVar23 * 4);
          if (iVar6 < pIVar9[lVar23]) {
            iVar19 = *(int *)((long)pIVar10 + (long)iVar22 * 4);
            if ((iVar19 == pIVar9[iVar22]) ||
               ((float)pIVar9[iVar22] / (float)iVar19 < (float)pIVar9[lVar23] / (float)iVar6)) {
              iVar22 = (int)lVar23;
            }
          }
          lVar23 = lVar23 + 1;
        } while ((int)(uint)local_90.opaque_internals != lVar23);
        lVar23 = (long)iVar22;
      }
      iVar22 = *(int *)((long)pIVar10 + lVar23 * 4);
      if (pIVar9[lVar23] <= iVar22) break;
      *(int *)((long)pIVar10 + lVar23 * 4) = iVar22 + 1;
    }
    for (; (int)local_94 < iVar17; iVar17 = iVar17 + -1) {
      if ((long)(int)(uint)local_90.opaque_internals < 2) {
        lVar23 = 0;
      }
      else {
        uVar30 = 0;
        uVar26 = 1;
        do {
          iVar22 = *(int *)((long)pIVar10 + uVar26 * 4);
          if (1 < iVar22) {
            iVar6 = *(int *)((long)pIVar10 + (long)(int)uVar30 * 4);
            if ((iVar6 < 2) ||
               ((float)pIVar9[uVar26] / (float)iVar22 < (float)pIVar9[(int)uVar30] / (float)iVar6))
            {
              uVar30 = uVar26 & 0xffffffff;
            }
          }
          uVar26 = uVar26 + 1;
        } while ((long)(int)(uint)local_90.opaque_internals != uVar26);
        lVar23 = (long)(int)uVar30;
      }
      piVar2 = (int *)((long)pIVar10 + lVar23 * 4);
      *piVar2 = *piVar2 + -1;
    }
    memset(__s,0,(long)(int)(uint)local_90.opaque_internals << 2);
    if (0 < (int)local_94) {
      lVar23 = 0;
      do {
        *(undefined4 *)((long)pIVar11 + lVar23 * 4) = 0xffffffff;
        lVar23 = lVar23 + 1;
      } while (lVar23 < (int)local_94);
    }
    if (0 < (int)(uint)local_90.opaque_internals) {
      lVar23 = 0;
      do {
        if (0 < pIVar9[lVar23]) {
          *(int *)((long)pIVar11 + (long)*(int *)((long)local_58.opaque_internals + lVar23 * 4) * 4)
               = (int)lVar23;
          *(IceTInt *)
           ((long)local_60 +
           ((long)*(int *)((long)__s + lVar23 * 4) + (long)(int)lVar23 * (long)(int)local_94) * 4) =
               *(IceTInt *)((long)local_58.opaque_internals + lVar23 * 4);
          piVar2 = (int *)((long)__s + lVar23 * 4);
          *piVar2 = *piVar2 + 1;
        }
        lVar23 = lVar23 + 1;
      } while (lVar23 < (int)(uint)local_90.opaque_internals);
    }
    if (0 < (int)local_94) {
      lVar23 = 0;
      do {
        if ((*(int *)((long)pIVar11 + lVar23 * 4) < 0) &&
           (0 < (long)(int)(uint)local_90.opaque_internals)) {
          lVar18 = 0;
          do {
            if ((local_78[lVar18 + (int)((uint)local_90.opaque_internals * (int)lVar23)] != '\0') &&
               (*(int *)((long)__s + lVar18 * 4) < *(int *)((long)pIVar10 + lVar18 * 4))) {
              *(int *)((long)pIVar11 + lVar23 * 4) = (int)lVar18;
              *(int *)((long)local_60 +
                      ((long)*(int *)((long)__s + lVar18 * 4) +
                      (long)(int)lVar18 * (long)(int)local_94) * 4) = (int)lVar23;
              piVar2 = (int *)((long)__s + lVar18 * 4);
              *piVar2 = *piVar2 + 1;
              break;
            }
            lVar18 = lVar18 + 1;
          } while ((int)(uint)local_90.opaque_internals != lVar18);
        }
        lVar23 = lVar23 + 1;
      } while (lVar23 < (int)local_94);
    }
    if (0 < (int)(uint)local_90.opaque_internals) {
      lVar23 = 0;
      iVar17 = 0;
      do {
        if (*(int *)((long)__s + lVar23 * 4) < *(int *)((long)pIVar10 + lVar23 * 4)) {
          do {
            lVar18 = (long)iVar17;
            iVar17 = iVar17 + -1;
            piVar2 = (int *)(lVar18 * 4 + (long)pIVar11);
            do {
              piVar24 = piVar2;
              iVar17 = iVar17 + 1;
              piVar2 = piVar24 + 1;
            } while (-1 < *piVar24);
            *piVar24 = (int)lVar23;
            *(int *)((long)local_60 +
                    ((long)*(int *)((long)__s + lVar23 * 4) +
                    (long)(int)local_94 * (long)(int)lVar23) * 4) = iVar17;
            iVar22 = *(int *)((long)__s + lVar23 * 4) + 1;
            *(int *)((long)__s + lVar23 * 4) = iVar22;
          } while (iVar22 < *(int *)((long)pIVar10 + lVar23 * 4));
        }
        lVar23 = lVar23 + 1;
      } while (lVar23 < (int)(uint)local_90.opaque_internals);
    }
    uVar26 = (ulong)(uint)local_90.opaque_internals;
    local_48 = 0;
    local_84 = 0;
    pIVar9 = local_60;
    if (0 < (int)(uint)local_90.opaque_internals) {
      local_50 = local_78;
      local_80 = (IceTInt *)0x0;
      uVar30 = 0;
      local_84 = 0;
      pIVar29 = local_60;
      do {
        lVar23 = (long)(int)local_94;
        if ((uVar30 == *(uint *)((long)pIVar11 + (long)local_88 * 4)) ||
           (pIVar9 = pIVar29, local_78[(long)local_88 * (long)(int)uVar26 + uVar30] != '\0')) {
          lVar18 = uVar30 * lVar23;
          IVar5 = icetIsEnabled(0x142);
          pIVar9 = local_60;
          if (IVar5 == '\0') {
            if ((uVar30 == *(uint *)((long)pIVar11 + (long)local_88 * 4)) &&
               (local_78[(long)(int)(uint)local_90.opaque_internals * (long)local_88 + uVar30] !=
                '\0')) {
              local_68[uVar30] = local_88;
            }
            bVar21 = true;
            iVar17 = -1;
            lVar23 = -1;
            do {
              lVar20 = lVar23;
              do {
                lVar23 = (long)(int)lVar20;
                lVar25 = lVar20 << 0x20;
                pIVar28 = local_50 + (lVar23 + 1) * (long)(int)(uint)local_90.opaque_internals;
                do {
                  lVar23 = lVar23 + 1;
                  if ((int)local_94 <= lVar23) goto LAB_0011665a;
                  lVar25 = lVar25 + 0x100000000;
                  IVar5 = *pIVar28;
                  pIVar28 = pIVar28 + (int)(uint)local_90.opaque_internals;
                } while (IVar5 == '\0');
                lVar20 = lVar23;
              } while (uVar30 == *(uint *)((long)pIVar11 + (lVar25 >> 0x1e)));
              bVar4 = bVar21;
              do {
                bVar21 = bVar4;
                iVar17 = iVar17 + 1;
                if (*(int *)((long)__s + uVar30 * 4) <= iVar17) {
                  iVar17 = 0;
                  bVar21 = false;
                }
                iVar22 = *(int *)((long)pIVar29 + (long)iVar17 * 4 + lVar18 * 4);
              } while (((bVar21) &&
                       (local_78[(long)(int)(iVar22 * (uint)local_90.opaque_internals) + uVar30] !=
                        '\0')) &&
                      (bVar4 = true, uVar30 == *(uint *)((long)pIVar11 + (long)iVar22 * 4)));
              if (local_88 == (int)lVar23) {
                local_68[uVar30] = iVar22;
              }
            } while( true );
          }
          if ((int)local_94 < 1) {
            uVar7 = 0;
          }
          else {
            lVar20 = 0;
            uVar7 = 0;
            do {
              if (local_78[(long)(int)(uint)local_90.opaque_internals * (long)local_40[lVar20] +
                           uVar30] != '\0') {
                *(IceTInt *)((long)pIVar12 + (long)(int)uVar7 * 4) = local_40[lVar20];
                uVar7 = uVar7 + 1;
              }
              lVar20 = lVar20 + 1;
            } while (lVar20 < (int)local_94);
          }
          if (0 < (int)uVar7) {
            uVar26 = 0;
            do {
              uVar3 = *(uint *)((long)__s + uVar30 * 4);
              iVar17 = *(int *)((long)pIVar12 + uVar26 * 4);
              uVar27 = (ulong)uVar3;
              if (uVar30 == *(uint *)((long)pIVar11 + (long)iVar17 * 4)) {
                do {
                  if ((int)uVar27 < 1) goto LAB_001165dd;
                  uVar1 = uVar27 - 1;
                  lVar20 = uVar27 * 4;
                  uVar27 = uVar1;
                } while (*(int *)((long)local_60 + lVar20 + (long)local_80 * lVar23 + -4) != iVar17)
                ;
                lVar20 = (long)((int)((int)uVar26 * uVar3) / (int)uVar7);
                *(undefined4 *)((long)local_60 + uVar1 * 4 + (long)local_80 * lVar23) =
                     *(undefined4 *)((long)pIVar29 + lVar20 * 4 + lVar18 * 4);
                *(int *)((long)pIVar29 + lVar20 * 4 + lVar18 * 4) = iVar17;
              }
LAB_001165dd:
              uVar26 = uVar26 + 1;
            } while (uVar26 != uVar7);
          }
          if ((uVar30 == *(uint *)((long)pIVar11 + (long)local_88 * 4)) &&
             (lVar20 = (long)*(int *)((long)__s + uVar30 * 4), 0 < lVar20)) {
            lVar25 = 0;
            do {
              if (*(int *)((long)local_60 + lVar25 * 4 + lVar23 * (long)local_80) ==
                  *(int *)((long)local_58.opaque_internals + uVar30 * 4)) {
                local_84 = (IceTInt)lVar25;
                break;
              }
              lVar25 = lVar25 + 1;
            } while (lVar20 != lVar25);
          }
          if (0 < (int)uVar7) {
            uVar26 = 0;
            do {
              if (*(int *)((long)pIVar12 + uVar26 * 4) == local_88) {
                local_68[uVar30] =
                     *(IceTInt *)
                      ((long)pIVar29 +
                      (long)((*(int *)((long)__s + uVar30 * 4) * (int)uVar26) / (int)uVar7) * 4 +
                      lVar18 * 4);
              }
              uVar26 = uVar26 + 1;
            } while (uVar7 != uVar26);
          }
        }
LAB_0011665a:
        uVar30 = uVar30 + 1;
        uVar26 = (ulong)(int)(uint)local_90.opaque_internals;
        local_80 = (IceTInt *)((long)local_80 + 4);
        local_50 = local_50 + 1;
        pIVar29 = pIVar9;
      } while ((long)uVar30 < (long)uVar26);
    }
    uVar26 = (ulong)*(int *)((long)pIVar11 + (long)local_88 * 4);
    if (-1 < (long)uVar26) {
      local_80 = (IceTInt *)((long)pIVar9 + (long)(int)local_94 * uVar26 * 4);
      local_48 = (ulong)*(uint *)((long)__s + uVar26 * 4);
      goto LAB_001166b1;
    }
  }
  local_80 = (IceTInt *)0x0;
  local_84 = 0;
LAB_001166b1:
  icetGetIntegerv(0x13,(IceTInt *)&local_90);
  icetGetIntegerv(0x14,(IceTInt *)&local_94);
  IVar8 = icetSparseImageBufferSize((uint)local_90.opaque_internals,local_94);
  pIVar10 = icetGetStateBuffer(0x1a1,IVar8);
  IVar13 = icetGetStateBufferSparseImage(0x1a0,(uint)local_90.opaque_internals,local_94);
  IVar14 = icetGetStateBufferSparseImage(0x1a2,(uint)local_90.opaque_internals,local_94);
  IVar15 = icetGetStateBufferSparseImage(0x1a3,(uint)local_90.opaque_internals,local_94);
  icetRenderTransferSparseImages(IVar14,IVar15,pIVar10,IVar13,local_68,&local_38);
  iVar17 = (int)uVar26;
  if (-1 < iVar17) {
    IVar13.opaque_internals._4_4_ = local_38.opaque_internals._4_4_;
    IVar13.opaque_internals._0_4_ = (int)local_38.opaque_internals;
    icetSingleImageCompose(local_80,(IceTInt)local_48,local_84,IVar13,&local_90,&local_6c);
  }
  IVar5 = icetIsEnabled(0x146);
  if (IVar5 == '\0') {
    IVar14.opaque_internals._4_4_ = local_90.opaque_internals._4_4_;
    IVar14.opaque_internals._0_4_ = (uint)local_90.opaque_internals;
    IVar8 = icetSparseImageGetNumPixels(IVar14);
    pIVar9 = icetUnsafeStateGetInteger(0x11);
    if (IVar8 < 1) {
      IVar16 = icetImageNull();
      icetStateSetInteger(0x8c,-1);
      icetStateSetInteger(0x8d,0);
      IVar8 = 0;
    }
    else {
      IVar16 = icetGetStateBufferImage(0x1a0,pIVar9[(long)iVar17 + 2],pIVar9[(long)iVar17 + 3]);
      IVar15.opaque_internals._4_4_ = local_90.opaque_internals._4_4_;
      IVar15.opaque_internals._0_4_ = (uint)local_90.opaque_internals;
      icetDecompressSubImage(IVar15,local_6c,IVar16);
      icetStateSetInteger(0x8c,iVar17);
      icetStateSetInteger(0x8d,local_6c);
    }
    icetStateSetInteger(0x8e,IVar8);
  }
  else {
    local_50 = (IceTBoolean *)CONCAT44(local_50._4_4_,local_6c);
    local_78 = (IceTBoolean *)
               CONCAT44(local_90.opaque_internals._4_4_,(uint)local_90.opaque_internals);
    icetGetIntegerv(0x1b,(IceTInt *)&local_94);
    icetGetIntegerv(0x10,&local_88);
    pIVar9 = icetUnsafeStateGetInteger(0x11);
    local_60 = icetUnsafeStateGetInteger(0x1a);
    local_58 = icetImageNull();
    local_40 = (IceTInt *)uVar26;
    if (0 < local_88) {
      local_80 = (IceTInt *)(uVar26 & 0xffffffff);
      pIVar31 = pIVar9 + 3;
      pIVar9 = (IceTInt *)0x0;
      do {
        IVar8 = pIVar31[-1];
        height = *pIVar31;
        IVar13.opaque_internals = local_78;
        piece_offset_00 = (IceTSizeType)local_50;
        if (local_80 != pIVar9) {
          piece_offset_00 = 0;
          IVar13 = icetSparseImageNull();
        }
        if (pIVar9 == (IceTInt *)(ulong)local_94) {
          IVar16 = icetGetStateBufferImage(0x1a0,IVar8,height);
          local_58 = IVar16;
        }
        else if (local_80 == pIVar9) {
          IVar16 = icetGetStateBufferImage(0x1a1,IVar8,height);
        }
        else {
          IVar16 = icetImageNull();
        }
        icetSingleImageCollect(IVar13,local_60[(long)pIVar9],piece_offset_00,IVar16);
        pIVar9 = (IceTInt *)((long)pIVar9 + 1);
        pIVar31 = pIVar31 + 4;
      } while ((long)pIVar9 < (long)local_88);
    }
    icetGetIntegerv(0x1b,(IceTInt *)&local_94);
    IVar16.opaque_internals = local_58.opaque_internals;
    if ((-1 < (int)local_94) && (local_94 != (uint)local_40)) {
      icetClearImage(local_58);
    }
  }
  return (IceTImage)IVar16.opaque_internals;
}

Assistant:

static IceTInt reduceDelegate(IceTInt **tile_image_destp,
                              IceTInt **compose_groupp,
                              IceTInt *group_sizep,
                              IceTInt *group_image_destp)
{
    const IceTBoolean *all_contained_tiles_masks;
    const IceTInt *contrib_counts;
    IceTInt total_image_count;

    IceTInt num_tiles;
    IceTInt num_processes;
    IceTInt rank;
    const IceTInt *tile_display_nodes;
    const IceTInt *composite_order;

    IceTInt *num_proc_for_tile;
    IceTInt *node_assignment;
    IceTInt *tile_proc_groups;
    IceTInt *group_sizes;
    IceTInt *tile_image_dest;
    IceTInt group_image_dest = 0;
    IceTInt *contributors;

    IceTInt pcount;

    IceTInt tile, node;
    IceTInt snode, rnode, dest;
    IceTInt piece;
    IceTInt first_loop;

    all_contained_tiles_masks
        = icetUnsafeStateGetBoolean(ICET_ALL_CONTAINED_TILES_MASKS);
    contrib_counts = icetUnsafeStateGetInteger(ICET_TILE_CONTRIB_COUNTS);
    icetGetIntegerv(ICET_TOTAL_IMAGE_COUNT, &total_image_count);
    tile_display_nodes = icetUnsafeStateGetInteger(ICET_DISPLAY_NODES);
    composite_order = icetUnsafeStateGetInteger(ICET_COMPOSITE_ORDER);

    icetGetIntegerv(ICET_NUM_TILES, &num_tiles);
    icetGetIntegerv(ICET_NUM_PROCESSES, &num_processes);
    icetGetIntegerv(ICET_RANK, &rank);

    if (total_image_count < 1) {
        icetRaiseDebug("No nodes are drawing.");
        *tile_image_destp = NULL;
        *compose_groupp = NULL;
        *group_sizep = 0;
        *group_image_destp = 0;
        return -1;
    }

    num_proc_for_tile = icetGetStateBuffer(REDUCE_NUM_PROC_FOR_TILE_BUFFER,
                                           num_tiles * sizeof(IceTInt));
    node_assignment   = icetGetStateBuffer(REDUCE_NODE_ASSIGNMENT_BUFFER,
                                           num_processes * sizeof(IceTInt));
    tile_proc_groups  = icetGetStateBuffer(REDUCE_TILE_PROC_GROUPS_BUFFER,
                                             num_tiles * num_processes
                                           * sizeof(IceTInt));
    group_sizes       = icetGetStateBuffer(REDUCE_GROUP_SIZES_BUFFER,
                                           num_tiles * sizeof(IceTInt));
    tile_image_dest   = icetGetStateBuffer(REDUCE_TILE_IMAGE_DEST_BUFFER,
                                           num_tiles * sizeof(IceTInt));
    contributors      = icetGetStateBuffer(REDUCE_CONTRIBUTORS_BUFFER,
                                           num_processes * sizeof(IceTInt));

  /* Decide the minimum amount of processes that should be added to each
     tile. */
    pcount = 0;
    for (tile = 0; tile < num_tiles; tile++) {
        IceTInt allocate = (contrib_counts[tile]*num_processes)/total_image_count;
      /* Make sure at least one process is assigned to tiles that have at
         least one image. */
        if ((allocate < 1) && (contrib_counts[tile] > 0)) allocate = 1;
      /* Don't allocate more processes to a tile than images for that
         tile. */
        if (allocate > contrib_counts[tile]) allocate = contrib_counts[tile];

        num_proc_for_tile[tile] = allocate;

      /* Keep track of how many processes have been allocated. */
        pcount += allocate;
    }

  /* Handle when we have not allocated all the processes. */
    while (num_processes > pcount) {
      /* Find the tile with the largest image to process ratio that
         can still have a process added to it. */
        IceTInt max = 0;
        for (tile = 1; tile < num_tiles; tile++) {
            if (   (num_proc_for_tile[tile] < contrib_counts[tile])
                && (   (num_proc_for_tile[max] == contrib_counts[max])
                    || (  (float)contrib_counts[max]/num_proc_for_tile[max]
                        < (float)contrib_counts[tile]/num_proc_for_tile[tile])))
            {
                max = tile;
            }
        }
        if (num_proc_for_tile[max] < contrib_counts[max]) {
            num_proc_for_tile[max]++;
            pcount++;
        } else {
          /* Cannot assign any more processes. */
            break;
        }
    }

  /* Handle when we have allocated too many processes. */
    while (num_processes < pcount) {
      /* Find tile with the smallest image to process ratio that can still
         have a process removed. */
        IceTInt min = 0;
        for (tile = 1; tile < num_tiles; tile++) {
            if (   (num_proc_for_tile[tile] > 1)
                && (   (num_proc_for_tile[min] < 2)
                    || (  (float)contrib_counts[min]/num_proc_for_tile[min]
                        > (float)contrib_counts[tile]/num_proc_for_tile[tile])))
            {
                min = tile;
            }
        }
        num_proc_for_tile[min]--;
        pcount--;
    }

  /* Clear out arrays. */
    memset(group_sizes, 0, num_tiles*sizeof(IceTInt));
    for (node = 0; node < num_processes; node++) {
        node_assignment[node] = -1;
    }

#define ASSIGN_NODE2TILE(node, tile)                                    \
node_assignment[(node)] = (tile);                                       \
tile_proc_groups[(tile)*num_processes + group_sizes[(tile)]] = (node);  \
group_sizes[(tile)]++;

  /* Assign each display node to the group processing that tile if there
     are any images in that tile. */
    for (tile = 0; tile < num_tiles; tile++) {
        if (contrib_counts[tile] > 0) {
            ASSIGN_NODE2TILE(tile_display_nodes[tile], tile);
        }
    }

  /* Assign each node to a tile it is rendering, if possible. */
    for (node = 0; node < num_processes; node++) {
        if (node_assignment[node] < 0) {
            const IceTBoolean *tile_mask
                = all_contained_tiles_masks + node*num_tiles;
            for (tile = 0; tile < num_tiles; tile++) {
                if (   (tile_mask[tile])
                    && (group_sizes[tile] < num_proc_for_tile[tile])) {
                    ASSIGN_NODE2TILE(node, tile);
                    break;
                }
            }
        }
    }

  /* Assign rest of the nodes. */
    node = 0;
    for (tile = 0; tile < num_tiles; tile++) {
        while (group_sizes[tile] < num_proc_for_tile[tile]) {
            while (node_assignment[node] >= 0) node++;
            ASSIGN_NODE2TILE(node, tile);
        }
    }

  /* Now figure out who I am sending to and how many I am receiving. */
    for (tile = 0; tile < num_tiles; tile++) {
        IceTInt *proc_group = tile_proc_groups + tile*num_processes;

        if (   (node_assignment[rank] != tile)
            && !all_contained_tiles_masks[rank*num_tiles + tile]) {
          /* Not involved with this tile.  Skip it. */
            continue;
        }

        if (!icetIsEnabled(ICET_ORDERED_COMPOSITE)) {
          /* If we are not doing an ordered composite, then we are free
           * to assign processes to images in any way we please.  Here we
           * will do everything we can to minimize communication. */

          /* First, have processes send images to themselves when possible. */
            if (   (node_assignment[rank] == tile)
                && all_contained_tiles_masks[rank*num_tiles + tile]) {
                tile_image_dest[tile] = rank;
            }

            snode = -1;
            rnode = -1;
            first_loop = 1;
            while (1) {
              /* Find next process that still needs a place to send images. */
                do {
                    snode++;
                } while (   (snode < num_processes)
                         && !all_contained_tiles_masks[snode*num_tiles + tile]);
                if (snode >= num_processes) {
                  /* We must be finished. */
                    break;
                }
                if (node_assignment[snode] == tile) {
                  /* This node keeps image in itself. */
                    continue;
                }

              /* Find the next process that can accept the image. */
                do {
                    rnode++;
                    if (rnode >= group_sizes[tile]) {
                        rnode = 0;
                        first_loop = 0;
                    }
                    dest = proc_group[rnode];
                } while (   first_loop
                         && all_contained_tiles_masks[dest*num_tiles + tile]
                         && (node_assignment[dest] == tile));

              /* Check to see if this node is sending the image data. */
                if (snode == rank) {
                    tile_image_dest[tile] = dest;
                }
            }
        } else {
          /* We are doing an ordered composite.  It is vital that each process
           * gets images that are consecutive in the ordering.  Communication
           * costs come second. */

            IceTInt num_contributors = 0;
            int i;
          /* First, we make a list of all processes contributing to this
           * tile in the order in which the images need to be composed.
           * We will then split this list into contiguous chunks and assign
           * each chunk to a process. */
            for (i = 0; i < num_processes; i++) {
                snode = composite_order[i];
                if (all_contained_tiles_masks[snode*num_tiles + tile]) {
                  /* The process snode contains an image for this tile.
                   * Add it to compositors. */
                    contributors[num_contributors] = snode;
                    num_contributors++;
                }
            }
#ifdef DEBUG
            if (num_contributors != contrib_counts[tile]) {
                icetRaiseError("Miscounted number of tile contributions",
                               ICET_SANITY_CHECK_FAIL);
            }
#endif

          /* contributors is split up as evenly as possible.  We will
           * assign nodes in the order they appear in proc_group.  We now
           * re-order proc_group to minimize the communications. */
            for (i = 0; i < num_contributors; i++) {
                piece = i*group_sizes[tile]/num_contributors;
                snode = contributors[i];
                if (node_assignment[snode] == tile) {
                  /* snode is part of this group.  Assign it to piece it is
                   * part of. */
                    int j;
                    for (j = group_sizes[tile]-1; j >=0; j--) {
                        if (proc_group[j] == snode) {
                          /* Found snode in proc_group.  Place it at
                           * "piece" in proc_group. */
                            proc_group[j] = proc_group[piece];
                            proc_group[piece] = snode;
                            break;
                        }
                    }
#ifdef DEBUG
                    if (j < 0) {
                        icetRaiseError("node_assignment/proc_group mismatch",
                                       ICET_SANITY_CHECK_FAIL);
                    }
#endif
                }
            }

          /* We have just shuffled proc_group, so the tile display node is
           * no longer necessarily at 0.  Find out where it should be. */
            if (node_assignment[rank] == tile) {
                for (i = 0; i < group_sizes[tile]; i++) {
                    if (proc_group[i] == tile_display_nodes[tile]) {
                        group_image_dest = i;
                        break;
                    }
                }
#ifdef DEBUG
                if (i == group_sizes[tile]) {
                    icetRaiseError("Display process not participating in tile?",
                                   ICET_SANITY_CHECK_FAIL);
                }
#endif
            }

          /* Assign nodes in the order they appear in proc_group. */
            for (i = 0; i < num_contributors; i++) {
                piece = i*group_sizes[tile]/num_contributors;
                snode = contributors[i];
                rnode = proc_group[piece];
                
              /* Check to see if this node is sending the image data. */
                if (snode == rank) {
                    tile_image_dest[tile] = rnode;
                }
            }
        }
    }

    *tile_image_destp = tile_image_dest;
    if (node_assignment[rank] < 0) {
        *compose_groupp = NULL;
        *group_sizep = 0;
        *group_image_destp = 0;
    } else {
        *compose_groupp = tile_proc_groups+node_assignment[rank]*num_processes;
        *group_sizep = group_sizes[node_assignment[rank]];
        *group_image_destp = group_image_dest;
    }
    return node_assignment[rank];
}